

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O0

void test_append_ctx_helper(bson_t *bson,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  bcon_append_ctx_t ctx;
  va_list ap;
  undefined1 local_6630 [8];
  undefined8 local_6628;
  undefined8 local_6620;
  undefined8 local_6618;
  undefined8 local_6610;
  undefined8 local_6608;
  undefined8 local_6600;
  undefined8 local_65f0;
  undefined8 local_65e0;
  undefined8 local_65d0;
  undefined8 local_65c0;
  undefined8 local_65b0;
  undefined8 local_65a0;
  undefined8 local_6590;
  undefined1 local_6580 [25808];
  uint local_b0 [2];
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  
  if (in_AL != '\0') {
    local_6600 = in_XMM0_Qa;
    local_65f0 = in_XMM1_Qa;
    local_65e0 = in_XMM2_Qa;
    local_65d0 = in_XMM3_Qa;
    local_65c0 = in_XMM4_Qa;
    local_65b0 = in_XMM5_Qa;
    local_65a0 = in_XMM6_Qa;
    local_6590 = in_XMM7_Qa;
  }
  local_6628 = in_RSI;
  local_6620 = in_RDX;
  local_6618 = in_RCX;
  local_6610 = in_R8;
  local_6608 = in_R9;
  local_98 = in_RDI;
  bcon_append_ctx_init(local_6580);
  local_a0 = local_6630;
  local_a8 = &stack0x00000008;
  local_b0[1] = 0x30;
  local_b0[0] = 8;
  bcon_append_ctx_va(local_98,local_6580,local_b0);
  if (local_b0[0] < 0x29) {
    local_b0[0] = local_b0[0] + 8;
  }
  else {
    local_a8 = local_a8 + 8;
  }
  bcon_append_ctx(local_98,local_6580,"c","d",0);
  bcon_append_ctx_va(local_98,local_6580,local_b0);
  return;
}

Assistant:

static void
test_append_ctx_helper (bson_t *bson, ...)
{
   va_list ap;
   bcon_append_ctx_t ctx;
   bcon_append_ctx_init (&ctx);

   va_start (ap, bson);

   bcon_append_ctx_va (bson, &ctx, &ap);

   va_arg (ap, char *);

   BCON_APPEND_CTX (bson, &ctx, "c", "d");

   bcon_append_ctx_va (bson, &ctx, &ap);

   va_end (ap);
}